

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O0

vector<llvm::DILocal,_std::allocator<llvm::DILocal>_> * __thiscall
llvm::DWARFContext::getLocalsForAddress
          (vector<llvm::DILocal,_std::allocator<llvm::DILocal>_> *__return_storage_ptr__,
          DWARFContext *this,SectionedAddress Address)

{
  DWARFDie Subprogram_00;
  bool bVar1;
  DWARFUnit *this_00;
  DWARFDie DVar2;
  undefined1 auStack_58 [8];
  DWARFDie Subprogram;
  DWARFCompileUnit *CU;
  DWARFContext *this_local;
  SectionedAddress Address_local;
  vector<llvm::DILocal,_std::allocator<llvm::DILocal>_> *Result;
  
  std::vector<llvm::DILocal,_std::allocator<llvm::DILocal>_>::vector(__return_storage_ptr__);
  this_00 = &getCompileUnitForAddress(this,Address.Address)->super_DWARFUnit;
  if (this_00 != (DWARFUnit *)0x0) {
    DVar2 = DWARFUnit::getSubroutineForAddress(this_00,Address.Address);
    Subprogram.U = (DWARFUnit *)DVar2.Die;
    auStack_58 = (undefined1  [8])DVar2.U;
    bVar1 = DWARFDie::isValid((DWARFDie *)auStack_58);
    if (bVar1) {
      Subprogram_00.Die = (DWARFDebugInfoEntry *)Subprogram.U;
      Subprogram_00.U = (DWARFUnit *)auStack_58;
      DVar2.Die = (DWARFDebugInfoEntry *)Subprogram.U;
      DVar2.U = (DWARFUnit *)auStack_58;
      addLocalsForDie(this,(DWARFCompileUnit *)this_00,Subprogram_00,DVar2,__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<DILocal>
DWARFContext::getLocalsForAddress(object::SectionedAddress Address) {
  std::vector<DILocal> Result;
  DWARFCompileUnit *CU = getCompileUnitForAddress(Address.Address);
  if (!CU)
    return Result;

  DWARFDie Subprogram = CU->getSubroutineForAddress(Address.Address);
  if (Subprogram.isValid())
    addLocalsForDie(CU, Subprogram, Subprogram, Result);
  return Result;
}